

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

size_t __thiscall llvm::StringRef::find(StringRef *this,StringRef Str,size_t From)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  char *pcVar7;
  ulong uVar8;
  ulong __n;
  size_t sVar9;
  char *__s2;
  size_t sVar10;
  size_t sVar11;
  char *__s1;
  uint8_t BadCharSkip [256];
  byte local_138 [264];
  
  __n = Str.Length;
  __s2 = Str.Data;
  sVar10 = 0xffffffffffffffff;
  sVar9 = this->Length - From;
  sVar11 = sVar10;
  if (((From <= this->Length) && (sVar11 = From, __n != 0)) && (sVar11 = sVar10, __n <= sVar9)) {
    pcVar3 = this->Data;
    __s1 = pcVar3 + From;
    if (__n == 1) {
      pvVar6 = memchr(__s1,(int)*__s2,sVar9);
      sVar11 = -(ulong)(pvVar6 == (void *)0x0) | (long)pvVar6 - (long)pcVar3;
    }
    else if (__n < 0x100 && 0xf < sVar9) {
      pcVar7 = __s1 + (sVar9 - __n) + 1;
      memset(local_138,(int)Str.Length,0x100);
      sVar9 = __n - 1;
      uVar5 = 1;
      uVar8 = 0;
      do {
        if (__n <= uVar8) {
          __assert_fail("Index < Length && \"Invalid index!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                        ,0xef,"char llvm::StringRef::operator[](size_t) const");
        }
        local_138[(byte)__s2[uVar8]] = (char)sVar9 - (char)uVar8;
        uVar8 = (ulong)uVar5;
        uVar5 = uVar5 + 1;
      } while (sVar9 != uVar8);
      bVar1 = __s2[sVar9];
      do {
        bVar2 = __s1[sVar9];
        if ((bVar2 == bVar1) && (iVar4 = bcmp(__s1,__s2,sVar9), iVar4 == 0)) {
          return (long)__s1 - (long)pcVar3;
        }
        __s1 = __s1 + local_138[bVar2];
      } while (__s1 < pcVar7);
      sVar11 = 0xffffffffffffffff;
    }
    else {
      do {
        iVar4 = bcmp(pcVar3 + From,__s2,__n);
        if (iVar4 == 0) {
          return From;
        }
        pcVar7 = pcVar3 + From;
        From = From + 1;
      } while (pcVar7 < __s1 + (sVar9 - __n));
    }
  }
  return sVar11;
}

Assistant:

size_t StringRef::find(StringRef Str, size_t From) const {
  if (From > Length)
    return npos;

  const char *Start = Data + From;
  size_t Size = Length - From;

  const char *Needle = Str.data();
  size_t N = Str.size();
  if (N == 0)
    return From;
  if (Size < N)
    return npos;
  if (N == 1) {
    const char *Ptr = (const char *)::memchr(Start, Needle[0], Size);
    return Ptr == nullptr ? npos : Ptr - Data;
  }

  const char *Stop = Start + (Size - N + 1);

  // For short haystacks or unsupported needles fall back to the naive algorithm
  if (Size < 16 || N > 255) {
    do {
      if (std::memcmp(Start, Needle, N) == 0)
        return Start - Data;
      ++Start;
    } while (Start < Stop);
    return npos;
  }

  // Build the bad char heuristic table, with uint8_t to reduce cache thrashing.
  uint8_t BadCharSkip[256];
  std::memset(BadCharSkip, N, 256);
  for (unsigned i = 0; i != N-1; ++i)
    BadCharSkip[(uint8_t)Str[i]] = N-1-i;

  do {
    uint8_t Last = Start[N - 1];
    if (LLVM_UNLIKELY(Last == (uint8_t)Needle[N - 1]))
      if (std::memcmp(Start, Needle, N - 1) == 0)
        return Start - Data;

    // Otherwise skip the appropriate number of bytes.
    Start += BadCharSkip[Last];
  } while (Start < Stop);

  return npos;
}